

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fft.cpp
# Opt level: O0

void cftrec4(int n,double *a,int nw,double *w)

{
  int iVar1;
  int local_38;
  int local_34;
  int m;
  int k;
  int j;
  int isplt;
  double *w_local;
  int nw_local;
  double *a_local;
  int n_local;
  
  local_38 = n;
  while (0x200 < local_38) {
    iVar1 = local_38 >> 2;
    cftmdl1(iVar1,a + (n - iVar1),w + (nw - (local_38 >> 3)));
    local_38 = iVar1;
  }
  cftleaf(local_38,1,a + (n - local_38),nw,w);
  local_34 = 0;
  for (m = n - local_38; 0 < m; m = m - local_38) {
    local_34 = local_34 + 1;
    iVar1 = cfttree(local_38,m,local_34,a,nw,w);
    cftleaf(local_38,iVar1,a + (m - local_38),nw,w);
  }
  return;
}

Assistant:

void cftrec4(int n, double *a, int nw, double *w) {
  int cfttree(int n, int j, int k, double *a, int nw, double *w);
  void cftleaf(int n, int isplt, double *a, int nw, double *w);
  void cftmdl1(int n, double *a, double *w);
  int isplt, j, k, m;

  m = n;
  while (m > 512) {
    m >>= 2;
    cftmdl1(m, &a[n - m], &w[nw - (m >> 1)]);
  }
  cftleaf(m, 1, &a[n - m], nw, w);
  k = 0;
  for (j = n - m; j > 0; j -= m) {
    k++;
    isplt = cfttree(m, j, k, a, nw, w);
    cftleaf(m, isplt, &a[j - m], nw, w);
  }
}